

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_filter_rpm.c
# Opt level: O3

ssize_t rpm_filter_read(archive_read_filter *self,void **buff)

{
  uint uVar1;
  long *plVar2;
  long *plVar3;
  char *__src;
  ulong uVar4;
  ulong request;
  long lVar5;
  ulong request_00;
  long *plVar6;
  ulong uVar7;
  ssize_t avail_in;
  ulong local_60;
  long *local_58;
  long *local_50;
  archive_read_filter *local_48;
  void **local_40;
  long *local_38;
  
  plVar6 = (long *)self->data;
  request_00 = 0;
  *buff = (void *)0x0;
  local_60 = 0;
  local_58 = plVar6 + 1;
  local_38 = plVar6 + 3;
  __src = (char *)0x0;
  local_50 = plVar6;
  local_48 = self;
  local_40 = buff;
  do {
    if ((__src == (char *)0x0) &&
       (__src = (char *)__archive_read_filter_ahead(self->upstream,1,(ssize_t *)&local_60),
       __src == (char *)0x0)) {
      return (long)local_60 >> 0x3f & 0xffffffffffffffe2;
    }
    plVar3 = local_38;
    plVar2 = local_58;
    request = local_60;
    switch((int)plVar6[5]) {
    case 0:
      if ((long)(*plVar6 + local_60) < 0x60) {
        request_00 = request_00 + local_60;
      }
      else {
        lVar5 = 0x60 - *plVar6;
        request_00 = request_00 + lVar5;
        __src = __src + lVar5;
        *(undefined4 *)(plVar6 + 5) = 1;
        *local_58 = 0;
        local_58[1] = 0;
        *(undefined4 *)((long)plVar6 + 0x2c) = 1;
      }
      break;
    case 1:
      uVar4 = 0x10 - *local_58;
      uVar7 = local_60 - request_00;
      if (uVar4 < local_60 - request_00) {
        uVar7 = uVar4;
      }
      memcpy((void *)(*local_58 + (long)local_38),__src,uVar7);
      __src = __src + uVar7;
      request_00 = request_00 + uVar7;
      lVar5 = uVar7 + *plVar2;
      *plVar2 = lVar5;
      self = local_48;
      plVar6 = local_50;
      if (lVar5 == 0x10) {
        if (((((char)*plVar3 == -0x72) && (*(char *)((long)local_50 + 0x19) == -0x53)) &&
            (*(char *)((long)local_50 + 0x1a) == -0x18)) &&
           (*(char *)((long)local_50 + 0x1b) == '\x01')) {
          uVar1 = *(uint *)((long)local_50 + 0x24);
          local_50[2] = ((ulong)((uint)*(byte *)((long)local_50 + 0x23) << 4 |
                                 (uint)*(byte *)((long)local_50 + 0x22) << 0xc |
                                (uint)*(byte *)((long)local_50 + 0x21) << 0x14) |
                        (ulong)*(byte *)(local_50 + 4) << 0x1c) +
                        (ulong)(uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 |
                               uVar1 << 0x18) + 0x10;
          local_50[5] = 2;
          break;
        }
        if (*(int *)((long)local_50 + 0x2c) != 0) {
          archive_set_error(&local_48->archive->archive,0x54,"Unrecognized rpm header");
          return -0x1e;
        }
        *(undefined4 *)(local_50 + 5) = 4;
        *local_40 = plVar3;
        uVar7 = 0x10;
      }
      else {
        uVar7 = 0;
      }
      goto LAB_00115df6;
    case 2:
      uVar4 = plVar6[2] - plVar6[1];
      uVar7 = local_60 - request_00;
      if (uVar4 < local_60 - request_00) {
        uVar7 = uVar4;
      }
      __src = __src + uVar7;
      request_00 = request_00 + uVar7;
      lVar5 = uVar7 + plVar6[1];
      plVar6[1] = lVar5;
      if (lVar5 == plVar6[2]) {
        *(undefined4 *)(plVar6 + 5) = 3;
      }
      break;
    case 3:
      if ((long)local_60 <= (long)request_00) break;
      do {
        if (*__src != '\0') {
          *(undefined4 *)(plVar6 + 5) = 1;
          *local_58 = 0;
          local_58[1] = 0;
          goto switchD_00115c15_default;
        }
        __src = __src + 1;
        request_00 = request_00 + 1;
      } while (local_60 != request_00);
      uVar7 = 0;
      goto LAB_00115dfb;
    case 4:
      *local_40 = __src;
      uVar7 = local_60;
      goto LAB_00115dfb;
    }
switchD_00115c15_default:
    uVar7 = 0;
LAB_00115df6:
    if (request_00 == request) {
LAB_00115dfb:
      *plVar6 = *plVar6 + request;
      __archive_read_filter_consume(self->upstream,request);
      request_00 = 0;
      __src = (char *)0x0;
      request = local_60;
    }
    if ((uVar7 != 0) || ((long)request < 1)) {
      if ((0 < (long)request_00) && (__src != (char *)0x0)) {
        *plVar6 = *plVar6 + request_00;
        __archive_read_filter_consume(self->upstream,request_00);
      }
      return uVar7;
    }
  } while( true );
}

Assistant:

static ssize_t
rpm_filter_read(struct archive_read_filter *self, const void **buff)
{
	struct rpm *rpm;
	const unsigned char *b;
	ssize_t avail_in, total, used;
	size_t n;
	uint64_t section;
	uint64_t bytes;

	rpm = (struct rpm *)self->data;
	*buff = NULL;
	total = avail_in = 0;
	b = NULL;
	used = 0;
	do {
		if (b == NULL) {
			b = __archive_read_filter_ahead(self->upstream, 1,
			    &avail_in);
			if (b == NULL) {
				if (avail_in < 0)
					return (ARCHIVE_FATAL);
				else
					break;
			}
		}

		switch (rpm->state) {
		case ST_LEAD:
			if (rpm->total_in + avail_in < RPM_LEAD_SIZE)
				used += avail_in;
			else {
				n = (size_t)(RPM_LEAD_SIZE - rpm->total_in);
				used += n;
				b += n;
				rpm->state = ST_HEADER;
				rpm->hpos = 0;
				rpm->hlen = 0;
				rpm->first_header = 1;
			}
			break;
		case ST_HEADER:
			n = rpm_limit_bytes(RPM_MIN_HEAD_SIZE - rpm->hpos,
			    avail_in - used);
			memcpy(rpm->header+rpm->hpos, b, n);
			b += n;
			used += n;
			rpm->hpos += n;

			if (rpm->hpos == RPM_MIN_HEAD_SIZE) {
				if (rpm->header[0] != 0x8e ||
				    rpm->header[1] != 0xad ||
				    rpm->header[2] != 0xe8 ||
				    rpm->header[3] != 0x01) {
					if (rpm->first_header) {
						archive_set_error(
						    &self->archive->archive,
						    ARCHIVE_ERRNO_FILE_FORMAT,
						    "Unrecognized rpm header");
						return (ARCHIVE_FATAL);
					}
					rpm->state = ST_ARCHIVE;
					*buff = rpm->header;
					total = RPM_MIN_HEAD_SIZE;
					break;
				}
				/* Calculate 'Header' length. */
				section = archive_be32dec(rpm->header+8);
				bytes = archive_be32dec(rpm->header+12);
				rpm->hlen = rpm->hpos + section * 16 + bytes;
				rpm->state = ST_HEADER_DATA;
				rpm->first_header = 0;
			}
			break;
		case ST_HEADER_DATA:
			n = rpm_limit_bytes(rpm->hlen - rpm->hpos,
			    avail_in - used);
			b += n;
			used += n;
			rpm->hpos += n;
			if (rpm->hpos == rpm->hlen)
				rpm->state = ST_PADDING;
			break;
		case ST_PADDING:
			while (used < avail_in) {
				if (*b != 0) {
					/* Read next header. */
					rpm->state = ST_HEADER;
					rpm->hpos = 0;
					rpm->hlen = 0;
					break;
				}
				b++;
				used++;
			}
			break;
		case ST_ARCHIVE:
			*buff = b;
			total = avail_in;
			used = avail_in;
			break;
		}
		if (used == avail_in) {
			rpm->total_in += used;
			__archive_read_filter_consume(self->upstream, used);
			b = NULL;
			used = 0;
		}
	} while (total == 0 && avail_in > 0);

	if (used > 0 && b != NULL) {
		rpm->total_in += used;
		__archive_read_filter_consume(self->upstream, used);
	}
	return (total);
}